

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O1

void SstFFSMarshalAttribute
               (SstStream Stream,char *Name,int Type,size_t ElemSize,size_t ElemCount,void *Data)

{
  void *pvVar1;
  void *pvVar2;
  uint uVar3;
  size_t sVar4;
  char *__s;
  char *Type_00;
  long lVar5;
  void *pvVar6;
  ulong __n;
  bool bVar7;
  void *local_38;
  
  pvVar1 = Stream->WriterMarshalData;
  bVar7 = Type == 0xe;
  local_38 = (void *)0x0;
  if (bVar7) {
    local_38 = Data;
  }
  if (bVar7) {
    Data = &local_38;
  }
  __n = 8;
  if (!bVar7) {
    __n = ElemSize;
  }
  if (ElemCount == 0xffffffffffffffff) {
    sVar4 = strlen(Name);
    __s = (char *)malloc(sVar4 + 0x16);
    snprintf(__s,sVar4 + 0x16,"SST%d_%d_",__n & 0xffffffff,(ulong)(uint)Type);
    strcat(__s,Name);
    Type_00 = TranslateADIOS2Type2FFS(Type);
    AddSimpleField((FMFieldList *)((long)pvVar1 + 0x50),(int *)((long)pvVar1 + 0x48),__s,Type_00,
                   (int)__n);
    free(Type_00);
    free(__s);
    pvVar2 = Stream->WriterMarshalData;
    lVar5 = (long)*(int *)((long)pvVar2 + 0x48);
    if (lVar5 != 0) {
      uVar3 = *(int *)(*(long *)((long)pvVar2 + 0x50) + -4 + lVar5 * 0x18) +
              *(int *)(*(long *)((long)pvVar2 + 0x50) + -8 + lVar5 * 0x18) + 7U & 0xfffffff8;
      pvVar6 = realloc(*(void **)((long)pvVar2 + 0x60),(long)(int)uVar3 + 8);
      *(void **)((long)pvVar2 + 0x60) = pvVar6;
      memset((void *)((long)pvVar6 + (long)*(int *)((long)pvVar2 + 0x68)),0,
             (long)(int)uVar3 - (long)*(int *)((long)pvVar2 + 0x68));
      *(uint *)((long)pvVar2 + 0x68) = uVar3;
    }
    memcpy((void *)((long)*(int *)(*(long *)((long)pvVar1 + 0x50) + -4 +
                                  (long)*(int *)((long)pvVar1 + 0x48) * 0x18) +
                   *(long *)((long)pvVar1 + 0x60)),Data,__n);
  }
  return;
}

Assistant:

extern void SstFFSMarshalAttribute(SstStream Stream, const char *Name, const int Type,
                                   size_t ElemSize, size_t ElemCount, const void *Data)
{

    struct FFSWriterMarshalBase *Info;
    Info = (struct FFSWriterMarshalBase *)Stream->WriterMarshalData;
    const char *AttrString = NULL;
    const char *DataAddress = Data;

    if (Type == String)
    {
        ElemSize = sizeof(char *);
        AttrString = Data;
        DataAddress = (const char *)&AttrString;
    }
    if (ElemCount == (size_t)(-1))
    {
        // simple field, only simple attribute name and value
        char *SstName = BuildVarName(Name, Type, (int)ElemSize);
        AddField(&Info->AttributeFields, &Info->AttributeFieldCount, SstName, Type, (int)ElemSize);
        free(SstName);
        RecalcAttributeStorageSize(Stream);
        int DataOffset = Info->AttributeFields[Info->AttributeFieldCount - 1].field_offset;
        memcpy((char *)(Info->AttributeData) + DataOffset, DataAddress, ElemSize);
    }
    else
    {
        /* // Array field.  To Metadata, add FMFields for DimCount, Shape, Count
         */
        /* // and Offsets matching _MetaArrayRec */
        /* char *ArrayName = BuildStaticArrayName(Name, Type, ElemCount); */
        /* AddField(&Info->AttributeFields, &Info->AttributeFieldCount,
         * ArrayName, Type, */
        /*          sizeof(size_t)); */
        /* free(ArrayName); */
        /* Rec->MetaOffset = */
        /*     Info->MetaFields[Info->MetaFieldCount - 1].field_offset; */
        /* char *ShapeName = ConcatName(Name, "Shape"); */
        /* char *CountName = ConcatName(Name, "Count"); */
        /* char *OffsetsName = ConcatName(Name, "Offsets"); */
        /* AddFixedArrayField(&Info->MetaFields, &Info->MetaFieldCount,
         * ShapeName, */
        /*                    "integer", sizeof(size_t), DimCount); */
        /* AddFixedArrayField(&Info->MetaFields, &Info->MetaFieldCount,
         * CountName, */
        /*                    "integer", sizeof(size_t), DimCount); */
        /* AddFixedArrayField(&Info->MetaFields, &Info->MetaFieldCount, */
        /*                    OffsetsName, "integer", sizeof(size_t), DimCount);
         */
        /* free(ShapeName); */
        /* free(CountName); */
        /* free(OffsetsName); */
        /* RecalcMarshalStorageSize(Stream); */

        /* if ((Stream->ConfigParams->CompressionMethod == SstCompressZFP) && */
        /*     ZFPcompressionPossible(Type, DimCount)) */
        /* { */
        /*     Type = "char"; */
        /*     ElemSize = 1; */
        /* } */
        /* // To Data, add FMFields for ElemCount and Array matching _ArrayRec
         */
        /* char *ElemCountName = ConcatName(Name, "ElemCount"); */
        /* AddField(&Info->DataFields, &Info->DataFieldCount, ElemCountName, */
        /*          "integer", sizeof(size_t)); */
        /* Rec->DataOffset = */
        /*     Info->DataFields[Info->DataFieldCount - 1].field_offset; */
        /* char *SstName = ConcatName(Name, ""); */
        /* AddVarArrayField(&Info->DataFields, &Info->DataFieldCount, SstName,
         */
        /*                  Type, ElemSize, ElemCountName); */
        /* free(SstName); */
        /* free(ElemCountName); */
        /* RecalcMarshalStorageSize(Stream); */
        /* // Changing the formats renders these invalid */
        /* Info->MetaFormat = NULL; */
        /* Info->DataFormat = NULL; */
    }
}